

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O3

void __thiscall
AV1Kmeans::AV1KmeansTest2::RunSpeedTest
          (AV1KmeansTest2 *this,av1_calc_indices_dim2_func test_impl,BLOCK_SIZE_conflict bsize,int k
          )

{
  av1_calc_indices_dim2_func p_Var1;
  double dVar2;
  double dVar3;
  int16_t *piVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000011;
  long lVar8;
  av1_calc_indices_dim2_func *pp_Var9;
  int j;
  uint uVar10;
  double *pdVar11;
  uint uVar12;
  aom_usec_timer timer;
  double local_a0;
  double local_98 [2];
  double local_88;
  int16_t *local_80;
  int16_t *local_78;
  uint8_t *local_70;
  ulong local_68;
  av1_calc_indices_dim2_func local_60;
  timeval local_58;
  timeval local_48;
  av1_calc_indices_dim2_func local_38;
  
  uVar6 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar12 = (uint)::block_size_high[uVar6] * (uint)::block_size_wide[uVar6];
  pp_Var9 = &local_38;
  local_38 = av1_calc_indices_dim2_c;
  pdVar11 = local_98;
  local_98[0] = 0.0;
  local_a0 = 0.0;
  local_78 = this->data_;
  uVar5 = (uint)(1000000000 / (ulong)uVar12);
  local_88 = (double)uVar5;
  uVar6 = CONCAT71((int7)(1000000000 / (ulong)uVar12 >> 8),1);
  local_80 = this->centroids_;
  local_70 = this->indices1_;
  local_60 = test_impl;
  do {
    local_68 = uVar6;
    gettimeofday(&local_58,(__timezone_ptr_t)0x0);
    piVar4 = local_78;
    p_Var1 = *pp_Var9;
    uVar10 = 0;
    do {
      (*p_Var1)(piVar4,this->centroids_,this->indices1_,(int64_t *)0x0,uVar12,k);
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar5);
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    dVar2 = local_a0;
    lVar7 = local_48.tv_usec - local_58.tv_usec;
    lVar8 = lVar7 + 1000000;
    if (-1 < lVar7) {
      lVar8 = lVar7;
    }
    *pdVar11 = ((double)(((lVar7 >> 0x3f) + (local_48.tv_sec - local_58.tv_sec)) * 1000000 + lVar8)
               * 1000.0) / local_88;
    dVar3 = local_98[0];
    pdVar11 = &local_a0;
    pp_Var9 = &local_60;
    uVar6 = 0;
  } while ((local_68 & 1) != 0);
  printf("av1_calc_indices_dim2 indices= %d centroids=%d: %7.2f/%7.2fns",(ulong)uVar12,
         (ulong)(uint)k);
  printf("(%3.2f)\n",dVar3 / dVar2);
  return;
}

Assistant:

void AV1KmeansTest2::RunSpeedTest(av1_calc_indices_dim2_func test_impl,
                                  BLOCK_SIZE bsize, int k) {
  const int w = block_size_wide[bsize];
  const int h = block_size_high[bsize];
  const int n = w * h;
  const int num_loops = 1000000000 / n;

  av1_calc_indices_dim2_func funcs[2] = { av1_calc_indices_dim2_c, test_impl };
  double elapsed_time[2] = { 0 };
  for (int i = 0; i < 2; ++i) {
    aom_usec_timer timer;
    aom_usec_timer_start(&timer);
    av1_calc_indices_dim2_func func = funcs[i];
    for (int j = 0; j < num_loops; ++j) {
      func(data_, centroids_, indices1_, /*total_dist=*/nullptr, n, k);
    }
    aom_usec_timer_mark(&timer);
    double time = static_cast<double>(aom_usec_timer_elapsed(&timer));
    elapsed_time[i] = 1000.0 * time / num_loops;
  }
  printf("av1_calc_indices_dim2 indices= %d centroids=%d: %7.2f/%7.2fns", n, k,
         elapsed_time[0], elapsed_time[1]);
  printf("(%3.2f)\n", elapsed_time[0] / elapsed_time[1]);
}